

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

char * caffe::UpgradeV1LayerType(V1LayerParameter_LayerType type)

{
  ostream *this;
  char *pcStack_10;
  V1LayerParameter_LayerType type_local;
  
  switch(type) {
  case V1LayerParameter_LayerType_NONE:
    pcStack_10 = "";
    break;
  case V1LayerParameter_LayerType_ACCURACY:
    pcStack_10 = "Accuracy";
    break;
  case V1LayerParameter_LayerType_BNLL:
    pcStack_10 = "BNLL";
    break;
  case V1LayerParameter_LayerType_CONCAT:
    pcStack_10 = "Concat";
    break;
  case V1LayerParameter_LayerType_CONVOLUTION:
    pcStack_10 = "Convolution";
    break;
  case V1LayerParameter_LayerType_DATA:
    pcStack_10 = "Data";
    break;
  case V1LayerParameter_LayerType_DROPOUT:
    pcStack_10 = "Dropout";
    break;
  case V1LayerParameter_LayerType_EUCLIDEAN_LOSS:
    pcStack_10 = "EuclideanLoss";
    break;
  case V1LayerParameter_LayerType_FLATTEN:
    pcStack_10 = "Flatten";
    break;
  case V1LayerParameter_LayerType_HDF5_DATA:
    pcStack_10 = "HDF5Data";
    break;
  case V1LayerParameter_LayerType_HDF5_OUTPUT:
    pcStack_10 = "HDF5Output";
    break;
  case V1LayerParameter_LayerType_IM2COL:
    pcStack_10 = "Im2col";
    break;
  case V1LayerParameter_LayerType_IMAGE_DATA:
    pcStack_10 = "ImageData";
    break;
  case V1LayerParameter_LayerType_INFOGAIN_LOSS:
    pcStack_10 = "InfogainLoss";
    break;
  case V1LayerParameter_LayerType_INNER_PRODUCT:
    pcStack_10 = "InnerProduct";
    break;
  case V1LayerParameter_LayerType_LRN:
    pcStack_10 = "LRN";
    break;
  case V1LayerParameter_LayerType_MULTINOMIAL_LOGISTIC_LOSS:
    pcStack_10 = "MultinomialLogisticLoss";
    break;
  case V1LayerParameter_LayerType_POOLING:
    pcStack_10 = "Pooling";
    break;
  case V1LayerParameter_LayerType_RELU:
    pcStack_10 = "ReLU";
    break;
  case V1LayerParameter_LayerType_SIGMOID:
    pcStack_10 = "Sigmoid";
    break;
  case V1LayerParameter_LayerType_SOFTMAX:
    pcStack_10 = "Softmax";
    break;
  case V1LayerParameter_LayerType_SOFTMAX_LOSS:
    pcStack_10 = "SoftmaxWithLoss";
    break;
  case V1LayerParameter_LayerType_SPLIT:
    pcStack_10 = "Split";
    break;
  case V1LayerParameter_LayerType_TANH:
    pcStack_10 = "TanH";
    break;
  case V1LayerParameter_LayerType_WINDOW_DATA:
    pcStack_10 = "WindowData";
    break;
  case V1LayerParameter_LayerType_ELTWISE:
    pcStack_10 = "Eltwise";
    break;
  case V1LayerParameter_LayerType_POWER:
    pcStack_10 = "Power";
    break;
  case V1LayerParameter_LayerType_SIGMOID_CROSS_ENTROPY_LOSS:
    pcStack_10 = "SigmoidCrossEntropyLoss";
    break;
  case V1LayerParameter_LayerType_HINGE_LOSS:
    pcStack_10 = "HingeLoss";
    break;
  case V1LayerParameter_LayerType_MEMORY_DATA:
    pcStack_10 = "MemoryData";
    break;
  case V1LayerParameter_LayerType_ARGMAX:
    pcStack_10 = "ArgMax";
    break;
  case V1LayerParameter_LayerType_THRESHOLD:
    pcStack_10 = "Threshold";
    break;
  case V1LayerParameter_LayerType_DUMMY_DATA:
    pcStack_10 = "DummyData";
    break;
  case V1LayerParameter_LayerType_SLICE:
    pcStack_10 = "Slice";
    break;
  case V1LayerParameter_LayerType_MVN:
    pcStack_10 = "MVN";
    break;
  case V1LayerParameter_LayerType_ABSVAL:
    pcStack_10 = "AbsVal";
    break;
  case V1LayerParameter_LayerType_SILENCE:
    pcStack_10 = "Silence";
    break;
  case V1LayerParameter_LayerType_CONTRASTIVE_LOSS:
    pcStack_10 = "ContrastiveLoss";
    break;
  case V1LayerParameter_LayerType_EXP:
    pcStack_10 = "Exp";
    break;
  case V1LayerParameter_LayerType_DECONVOLUTION:
    pcStack_10 = "Deconvolution";
    break;
  default:
    this = std::operator<<((ostream *)&std::cerr,"Unknown V1LayerParameter layer type: ");
    std::ostream::operator<<(this,type);
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* UpgradeV1LayerType(const V1LayerParameter_LayerType type) {
  switch (type) {
  case V1LayerParameter_LayerType_NONE:
    return "";
  case V1LayerParameter_LayerType_ABSVAL:
    return "AbsVal";
  case V1LayerParameter_LayerType_ACCURACY:
    return "Accuracy";
  case V1LayerParameter_LayerType_ARGMAX:
    return "ArgMax";
  case V1LayerParameter_LayerType_BNLL:
    return "BNLL";
  case V1LayerParameter_LayerType_CONCAT:
    return "Concat";
  case V1LayerParameter_LayerType_CONTRASTIVE_LOSS:
    return "ContrastiveLoss";
  case V1LayerParameter_LayerType_CONVOLUTION:
    return "Convolution";
  case V1LayerParameter_LayerType_DECONVOLUTION:
    return "Deconvolution";
  case V1LayerParameter_LayerType_DATA:
    return "Data";
  case V1LayerParameter_LayerType_DROPOUT:
    return "Dropout";
  case V1LayerParameter_LayerType_DUMMY_DATA:
    return "DummyData";
  case V1LayerParameter_LayerType_EUCLIDEAN_LOSS:
    return "EuclideanLoss";
  case V1LayerParameter_LayerType_ELTWISE:
    return "Eltwise";
  case V1LayerParameter_LayerType_EXP:
    return "Exp";
  case V1LayerParameter_LayerType_FLATTEN:
    return "Flatten";
  case V1LayerParameter_LayerType_HDF5_DATA:
    return "HDF5Data";
  case V1LayerParameter_LayerType_HDF5_OUTPUT:
    return "HDF5Output";
  case V1LayerParameter_LayerType_HINGE_LOSS:
    return "HingeLoss";
  case V1LayerParameter_LayerType_IM2COL:
    return "Im2col";
  case V1LayerParameter_LayerType_IMAGE_DATA:
    return "ImageData";
  case V1LayerParameter_LayerType_INFOGAIN_LOSS:
    return "InfogainLoss";
  case V1LayerParameter_LayerType_INNER_PRODUCT:
    return "InnerProduct";
  case V1LayerParameter_LayerType_LRN:
    return "LRN";
  case V1LayerParameter_LayerType_MEMORY_DATA:
    return "MemoryData";
  case V1LayerParameter_LayerType_MULTINOMIAL_LOGISTIC_LOSS:
    return "MultinomialLogisticLoss";
  case V1LayerParameter_LayerType_MVN:
    return "MVN";
  case V1LayerParameter_LayerType_POOLING:
    return "Pooling";
  case V1LayerParameter_LayerType_POWER:
    return "Power";
  case V1LayerParameter_LayerType_RELU:
    return "ReLU";
  case V1LayerParameter_LayerType_SIGMOID:
    return "Sigmoid";
  case V1LayerParameter_LayerType_SIGMOID_CROSS_ENTROPY_LOSS:
    return "SigmoidCrossEntropyLoss";
  case V1LayerParameter_LayerType_SILENCE:
    return "Silence";
  case V1LayerParameter_LayerType_SOFTMAX:
    return "Softmax";
  case V1LayerParameter_LayerType_SOFTMAX_LOSS:
    return "SoftmaxWithLoss";
  case V1LayerParameter_LayerType_SPLIT:
    return "Split";
  case V1LayerParameter_LayerType_SLICE:
    return "Slice";
  case V1LayerParameter_LayerType_TANH:
    return "TanH";
  case V1LayerParameter_LayerType_WINDOW_DATA:
    return "WindowData";
  case V1LayerParameter_LayerType_THRESHOLD:
    return "Threshold";
  default:
    LOG(FATAL) << "Unknown V1LayerParameter layer type: " << type;
    return "";
  }
}